

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O1

void display_rip(int how,char *kilbuf,char *pbuf,long umoney)

{
  nh_menuitem *pnVar1;
  valuable_data *pvVar2;
  short sVar3;
  long lVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  _func_void_nh_menuitem_ptr_int_nh_bool_char_ptr_int_char_ptr_int_int *p_Var9;
  boolean bVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  char *pcVar15;
  long lVar16;
  val_list *pvVar17;
  char *pcVar18;
  ulong uVar19;
  obj *poVar20;
  valuable_data *pvVar21;
  dungeon *pdVar22;
  char *pcVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  monst *mtmp;
  int *piVar27;
  menulist menu;
  char outrip_buf [256];
  
  iVar8 = program_state.stopprint;
  program_state.stopprint = 0;
  init_menulist(&menu);
  if (program_state.game_running == 0) {
    program_state.stopprint = 1;
    goto LAB_001964a0;
  }
  (*windowprocs.win_pause)(P_MESSAGE);
  if ((0xb < how) || (flags.tombstone == '\0')) goto LAB_001964a0;
  if (killer_format == 0) {
LAB_00196464:
    strcpy(outrip_buf,killed_by_prefix[how]);
    pcVar15 = an(killer);
  }
  else {
    if (killer_format != 1) {
      if (killer_format == 2) {
        strcpy(outrip_buf,killer);
        goto LAB_001964a0;
      }
      warning("bad killer format?");
      goto LAB_00196464;
    }
    strcpy(outrip_buf,killed_by_prefix[how]);
    pcVar15 = killer;
  }
  strcat(outrip_buf,pcVar15);
LAB_001964a0:
  if ((u.uhave._0_1_ & 1) == 0) {
    if (how == 0xf) {
      bVar10 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      if (bVar10 == '\0') {
        poVar20 = carrying(0xd8);
        if (poVar20 != (obj *)0x0) {
          sVar14 = strlen(kilbuf);
          builtin_strncpy(kilbuf + sVar14," (with a fake Amulet)",0x16);
        }
      }
      else {
        sVar14 = strlen(kilbuf);
        builtin_strncpy(kilbuf + sVar14," (in celestial disgrace)",0x19);
      }
    }
  }
  else {
    sVar14 = strlen(kilbuf);
    builtin_strncpy(kilbuf + sVar14," (with the Amulet)",0x13);
  }
  if (program_state.stopprint == 0) {
    pcVar15 = Goodbye();
    sprintf(pbuf,"%s %s the %s...",pcVar15,plname);
    lVar16 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
    lVar16 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
    }
    lVar16 = (long)menu.icount;
    menu.items[lVar16].accel = '\0';
    menu.items[lVar16].group_accel = '\0';
    menu.items[lVar16].selected = '\0';
    menu.items[lVar16].caption[0] = '\0';
    menu.items[lVar16].id = 0;
    menu.items[lVar16].role = MI_TEXT;
    menu.icount = menu.icount + 1;
  }
  if (how - 0xfU < 3) {
    pvVar17 = valuables;
    pvVar21 = gems;
    do {
      iVar12 = pvVar17->size;
      if (0 < (long)iVar12) {
        lVar16 = 0;
        do {
          *(undefined8 *)((long)&pvVar21->count + lVar16) = 0;
          lVar16 = lVar16 + 0x10;
        } while ((long)iVar12 * 0x10 != lVar16);
      }
      pvVar21 = pvVar17[1].list;
      pvVar17 = pvVar17 + 1;
    } while (pvVar21 != (valuable_data *)0x0);
    get_valuables(invent);
    pvVar17 = valuables;
    pvVar21 = gems;
    iVar12 = u.urscore;
    do {
      if (0 < (long)pvVar17->size) {
        lVar16 = 0;
        do {
          lVar4 = *(long *)((long)&pvVar21->count + lVar16);
          if (lVar4 != 0) {
            iVar12 = iVar12 + (int)lVar4 *
                              (int)objects[*(int *)((long)&pvVar21->typ + lVar16)].oc_cost;
            u.urscore = iVar12;
          }
          lVar16 = lVar16 + 0x10;
        } while ((long)pvVar17->size * 0x10 != lVar16);
      }
      pvVar21 = pvVar17[1].list;
      pvVar17 = pvVar17 + 1;
    } while (pvVar21 != (valuable_data *)0x0);
    artifact_score(invent,'\x01',&menu);
    keepdogs(1,(char *)0x0);
    **viz_array = **viz_array | 2;
    mtmp = mydogs;
    if (program_state.stopprint == 0) {
      builtin_strncpy(pbuf,"You",4);
    }
    if (mtmp == (monst *)0x0) {
      if (program_state.stopprint == 0) {
        sVar14 = strlen(pbuf);
        (pbuf + sVar14)[0] = ' ';
        (pbuf + sVar14)[1] = '\0';
      }
    }
    else {
      do {
        if (program_state.stopprint == 0) {
          pcVar15 = eos(pbuf);
          pcVar18 = mon_nam(mtmp);
          sprintf(pcVar15," and %s",pcVar18);
        }
        if (mtmp->mtame != '\0') {
          u.urscore = u.urscore + mtmp->mhp;
        }
        mtmp = mtmp->nmon;
      } while (mtmp != (monst *)0x0);
      if (program_state.stopprint == 0) {
        lVar16 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,pbuf);
        menu.icount = menu.icount + 1;
      }
      *pbuf = '\0';
    }
    if (program_state.stopprint == 0) {
      pcVar15 = eos(pbuf);
      pcVar18 = "escaped from the dungeon";
      if (how == 0x10) {
        pcVar18 = "defied the gods and escaped";
      }
      pcVar23 = "went to your reward";
      if (how != 0x11) {
        pcVar23 = pcVar18;
      }
      pcVar18 = "s";
      if (u.urscore == 1) {
        pcVar18 = "";
      }
      sprintf(pcVar15,"%s with %d point%s,",pcVar23,(ulong)(uint)u.urscore,pcVar18);
      lVar16 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pbuf);
      menu.icount = menu.icount + 1;
    }
    if (program_state.stopprint == 0) {
      artifact_score(invent,'\0',&menu);
    }
    pvVar17 = valuables;
    pvVar21 = gems;
    do {
      iVar12 = pvVar17->size;
      uVar26 = (ulong)iVar12;
      if (1 < (long)uVar26) {
        uVar19 = 1;
        do {
          lVar16 = pvVar21[uVar19].count;
          if (lVar16 != 0) {
            iVar13 = pvVar21[uVar19].typ;
            uVar7 = *(undefined4 *)&pvVar21[uVar19].field_0xc;
            uVar25 = uVar19 & 0xffffffff;
            do {
              iVar24 = (int)uVar25;
              if (lVar16 <= pvVar21[uVar25 - 1].count) goto LAB_001969ce;
              pvVar2 = pvVar21 + uVar25;
              iVar5 = pvVar21[uVar25 - 1].typ;
              uVar6 = *(undefined4 *)&pvVar21[uVar25 - 1].field_0xc;
              pvVar2->count = pvVar21[uVar25 - 1].count;
              pvVar2->typ = iVar5;
              *(undefined4 *)&pvVar2->field_0xc = uVar6;
              uVar25 = (ulong)(iVar24 - 1);
            } while (1 < iVar24);
            iVar24 = 0;
LAB_001969ce:
            pvVar21[iVar24].count = lVar16;
            pvVar21[iVar24].typ = iVar13;
            *(undefined4 *)&pvVar21[iVar24].field_0xc = uVar7;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar26);
      }
      if ((0 < iVar12) && (program_state.stopprint == 0)) {
        piVar27 = &pvVar21->typ;
        uVar19 = 1;
        do {
          lVar16 = ((valuable_data *)(piVar27 + -2))->count;
          if (lVar16 != 0) {
            iVar12 = *piVar27;
            if (iVar12 < 0x206 || objects[iVar12].oc_class != '\r') {
              poVar20 = mksobj(level,iVar12,'\0','\0');
              discover_object((int)poVar20->otyp,'\x01','\x01');
              poVar20->field_0x4a = poVar20->field_0x4a | 0x30;
              poVar20->onamelth = '\0';
              poVar20->quan = (int)lVar16;
              pcVar15 = xname(poVar20);
              sVar3 = objects[iVar12].oc_cost;
              pcVar18 = currency(2);
              sprintf(pbuf,"%8ld %s (worth %ld %s),",lVar16,pcVar15,sVar3 * lVar16,pcVar18);
              obfree(poVar20,(obj *)0x0);
            }
            else {
              pcVar15 = "s";
              if (lVar16 == 1) {
                pcVar15 = "";
              }
              sprintf(pbuf,"%8ld worthless piece%s of colored glass,",lVar16,pcVar15);
            }
            lVar16 = (long)menu.size;
            if (menu.size <= menu.icount) {
              menu.size = menu.size * 2;
              menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
            }
            pnVar1 = menu.items + menu.icount;
            pnVar1->id = 0;
            pnVar1->role = MI_TEXT;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,pbuf);
            menu.icount = menu.icount + 1;
          }
          if (uVar26 <= uVar19) break;
          piVar27 = piVar27 + 4;
          uVar19 = uVar19 + 1;
        } while (program_state.stopprint == 0);
      }
      pvVar21 = pvVar17[1].list;
      pvVar17 = pvVar17 + 1;
    } while (pvVar21 != (valuable_data *)0x0);
  }
  else if (program_state.stopprint == 0) {
    lVar16 = (long)u.uz.dnum;
    if (u.uz.dlevel < '\x01' && lVar16 == 0) {
      if (u.uz.dlevel < '\0') {
        pcVar15 = "passed away";
      }
      else {
        pcVar15 = ends[how];
      }
      sprintf(pbuf,"You %s beyond the confines of the dungeon",pcVar15);
    }
    else {
      bVar10 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      pdVar22 = (dungeon *)"The Astral Plane";
      if (bVar10 == '\0') {
        pdVar22 = dungeons + lVar16;
      }
      sprintf(pbuf,"You %s in %s",ends[how],pdVar22);
      if ((u.uz.dnum != dungeon_topology.d_astral_level.dnum) &&
         (bVar10 = on_level(&u.uz,&dungeon_topology.d_knox_level), bVar10 == '\0')) {
        pcVar15 = eos(pbuf);
        bVar10 = In_quest(&u.uz);
        if (bVar10 == '\0') {
          cVar11 = depth(&u.uz);
        }
        else {
          cVar11 = dunlev(&u.uz);
        }
        sprintf(pcVar15," on dungeon level %d",(ulong)(uint)(int)cVar11);
      }
    }
    pcVar15 = eos(pbuf);
    pcVar18 = "s";
    if (u.urscore == 1) {
      pcVar18 = "";
    }
    sprintf(pcVar15," with %d point%s,",(ulong)(uint)u.urscore,pcVar18);
    lVar16 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
  }
  if (program_state.stopprint == 0) {
    pcVar18 = "s";
    pcVar15 = "s";
    if (umoney == 1) {
      pcVar15 = "";
    }
    if (moves == 1) {
      pcVar18 = "";
    }
    sprintf(pbuf,"and %ld piece%s of gold, after %u move%s.",umoney,pcVar15,(ulong)moves,pcVar18);
    lVar16 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
  }
  if (program_state.stopprint == 0) {
    pcVar15 = "s";
    if (u.uhpmax == 1) {
      pcVar15 = "";
    }
    sprintf(pbuf,"You were level %d with a maximum of %d hit point%s when you %s.",
            (ulong)(uint)u.ulevel,(ulong)(uint)u.uhpmax,pcVar15,ends[how]);
    lVar16 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
    lVar16 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
    }
    lVar16 = (long)menu.icount;
    menu.items[lVar16].accel = '\0';
    menu.items[lVar16].group_accel = '\0';
    menu.items[lVar16].selected = '\0';
    menu.items[lVar16].caption[0] = '\0';
    menu.items[lVar16].id = 0;
    menu.items[lVar16].role = MI_TEXT;
    menu.icount = menu.icount + 1;
  }
  iVar12 = menu.icount;
  pnVar1 = menu.items;
  p_Var9 = windowprocs.win_outrip;
  if (program_state.stopprint == 0) {
    iVar13 = getyear();
    (*p_Var9)(pnVar1,iVar12,how < 0xc,plname,(int)umoney,outrip_buf,how,iVar13);
  }
  free(menu.items);
  program_state.stopprint = iVar8;
  return;
}

Assistant:

void display_rip(int how, char *kilbuf, char *pbuf, long umoney)
{
	char outrip_buf[BUFSZ];
	boolean show_endwin = FALSE;
	struct menulist menu;
	int saved_stopprint = done_stopprint;

	/* always show this under normal circumstances */
	done_stopprint = 0;

	init_menulist(&menu);

	/* clean up unneeded windows */
	if (program_state.game_running) {
	    win_pause_output(P_MESSAGE);

	    if (!done_stopprint || flags.tombstone)
		show_endwin = TRUE;

	    if ((how <= GENOCIDED || how == DISINTEGRATED) &&
		flags.tombstone && show_endwin) {
		/* Put together death description */
		switch (killer_format) {
		    default: warning("bad killer format?");
		    case KILLED_BY_AN:
			strcpy(outrip_buf, killed_by_prefix[how]);
			strcat(outrip_buf, an(killer));
			break;
		    case KILLED_BY:
			strcpy(outrip_buf, killed_by_prefix[how]);
			strcat(outrip_buf, killer);
			break;
		    case NO_KILLER_PREFIX:
			strcpy(outrip_buf, killer);
			break;
		}
	    }
	} else {
	    done_stopprint = 1;
	}

/* changing kilbuf really changes killer. we do it this way because
   killer is declared a (const char *)
*/
	if (u.uhave.amulet) strcat(kilbuf, " (with the Amulet)");
	else if (how == ESCAPED) {
	    if (Is_astralevel(&u.uz))	/* offered Amulet to wrong deity */
		strcat(kilbuf, " (in celestial disgrace)");
	    else if (carrying(FAKE_AMULET_OF_YENDOR))
		strcat(kilbuf, " (with a fake Amulet)");
		/* don't bother counting to see whether it should be plural */
	}

	if (!done_stopprint) {
	    sprintf(pbuf, "%s %s the %s...", Goodbye(), plname,
		   how != ASCENDED ?
		      (const char *) ((flags.female && urole.name.f) ?
		         urole.name.f : urole.name.m) :
		      (const char *) (flags.female ? "Demigoddess" : "Demigod"));
	    add_menutext(&menu, pbuf);
	    add_menutext(&menu, "");
	}

	if (how == ESCAPED || how == DEFIED || how == ASCENDED) {
	    struct monst *mtmp;
	    struct obj *otmp;
	    const struct val_list *val;
	    int i;

	    for (val = valuables; val->list; val++)
		for (i = 0; i < val->size; i++) {
		    val->list[i].count = 0L;
		}
	    get_valuables(invent);

	    /* add points for collected valuables */
	    for (val = valuables; val->list; val++)
		for (i = 0; i < val->size; i++)
		    if (val->list[i].count != 0L)
			u.urscore += val->list[i].count
				  * (long)objects[val->list[i].typ].oc_cost;

	    /* count the points for artifacts */
	    artifact_score(invent, TRUE, &menu);

	    keepdogs(1, NULL);	/* only pets follow you */
	    viz_array[0][0] |= IN_SIGHT; /* need visibility for naming */
	    mtmp = mydogs;
	    if (!done_stopprint) strcpy(pbuf, "You");
	    if (mtmp) {
		while (mtmp) {
		    if (!done_stopprint)
			sprintf(eos(pbuf), " and %s", mon_nam(mtmp));
		    if (mtmp->mtame)
			u.urscore += mtmp->mhp;
		    mtmp = mtmp->nmon;
		}
		if (!done_stopprint) add_menutext(&menu, pbuf);
		pbuf[0] = '\0';
	    } else {
		if (!done_stopprint) strcat(pbuf, " ");
	    }
	    if (!done_stopprint) {
		sprintf(eos(pbuf), "%s with %d point%s,",
			how==ASCENDED ? "went to your reward" :
			how==DEFIED   ? "defied the gods and escaped" :
					"escaped from the dungeon",
			u.urscore, plur(u.urscore));
		add_menutext(&menu, pbuf);
	    }

	    if (!done_stopprint)
		artifact_score(invent, FALSE, &menu);	/* list artifacts */

	    /* list valuables here */
	    for (val = valuables; val->list; val++) {
		sort_valuables(val->list, val->size);
		for (i = 0; i < val->size && !done_stopprint; i++) {
		    int typ = val->list[i].typ;
		    long count = val->list[i].count;

		    if (count == 0L) continue;
		    if (objects[typ].oc_class != GEM_CLASS || typ <= LAST_GEM) {
			otmp = mksobj(level, typ, FALSE, FALSE);
			makeknown(otmp->otyp);
			otmp->known = 1;	/* for fake amulets */
			otmp->dknown = 1;	/* seen it (blindness fix) */
			otmp->onamelth = 0;
			otmp->quan = count;
			sprintf(pbuf, "%8ld %s (worth %ld %s),",
				count, xname(otmp),
				count * (long)objects[typ].oc_cost, currency(2L));
			obfree(otmp, NULL);
		    } else {
			sprintf(pbuf,
				"%8ld worthless piece%s of colored glass,",
				count, plur(count));
		    }
		    add_menutext(&menu, pbuf);
		}
	    }

	} else if (!done_stopprint) {
	    /* did not escape or ascend */
	    if (u.uz.dnum == 0 && u.uz.dlevel <= 0) {
		/* level teleported out of the dungeon; `how' is DIED,
		   due to falling or to "arriving at heaven prematurely" */
		sprintf(pbuf, "You %s beyond the confines of the dungeon",
			(u.uz.dlevel < 0) ? "passed away" : ends[how]);
	    } else {
		/* more conventional demise */
		const char *where = dungeons[u.uz.dnum].dname;

		if (Is_astralevel(&u.uz)) where = "The Astral Plane";
		sprintf(pbuf, "You %s in %s", ends[how], where);
		if (!In_endgame(&u.uz) && !Is_knox(&u.uz))
		    sprintf(eos(pbuf), " on dungeon level %d",
			    In_quest(&u.uz) ? dunlev(&u.uz) : depth(&u.uz));
	    }

	    sprintf(eos(pbuf), " with %d point%s,",
		    u.urscore, plur(u.urscore));
	    add_menutext(&menu, pbuf);
	}

	if (!done_stopprint) {
	    sprintf(pbuf, "and %ld piece%s of gold, after %u move%s.",
		    umoney, plur(umoney), moves, plur(moves));
	    add_menutext(&menu, pbuf);
	}
	if (!done_stopprint) {
	    sprintf(pbuf,
	     "You were level %d with a maximum of %d hit point%s when you %s.",
		    u.ulevel, u.uhpmax, plur(u.uhpmax), ends[how]);
	    add_menutext(&menu, pbuf);
	    add_menutext(&menu, "");
	}
	if (!done_stopprint)
	    outrip(menu.items, menu.icount,
		   (how <= GENOCIDED || how == DISINTEGRATED), plname, umoney,
		   outrip_buf, how, getyear());

	free(menu.items);

	done_stopprint = saved_stopprint;
}